

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O0

char * escape_string_for_regex(char *s)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  char *sss;
  char *ss;
  char *s_local;
  
  sVar2 = strlen(s);
  pcVar3 = (char *)malloc((sVar2 + 1) * 2);
  sss = pcVar3;
  for (ss = s; *ss != '\0'; ss = ss + 1) {
    iVar1 = (int)*ss;
    if ((((iVar1 - 0x28U < 4) || (iVar1 == 0x2d)) || (iVar1 == 0x3f)) || (iVar1 - 0x5bU < 4)) {
      *sss = '\\';
      sss = sss + 1;
    }
    *sss = *ss;
    sss = sss + 1;
  }
  *sss = '\0';
  return pcVar3;
}

Assistant:

char *escape_string_for_regex(const char *s) {
  char *ss = (char *)MALLOC((strlen(s) + 1) * 2), *sss = ss;
  for (; *s; s++) {
    switch (*s) {
      case '(':
      case ')':
      case '[':
      case ']':
      case '-':
      case '^':
      case '*':
      case '?':
      case '+':
      case '\\':
        *ss++ = '\\';
        /* fall through */
      default:
        *ss++ = *s;
        break;
    }
  }
  *ss = 0;
  return sss;
}